

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall
Engine_testConstructWithHandler_Test::TestBody(Engine_testConstructWithHandler_Test *this)

{
  __uniq_ptr_impl<Handler,_std::default_delete<Handler>_> _Var1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar2;
  char *pcVar3;
  AssertHelper local_c8;
  AssertionResult gtest_ar_3;
  AssertHelper local_b0;
  _Head_base<0UL,_Handler_*,_false> local_a8;
  _Head_base<0UL,_Handler_*,_false> local_a0;
  Engine e1;
  string local_60;
  Engine e;
  
  std::make_unique<TestHandler>();
  local_a0._M_head_impl = (Handler *)e1.prefix._M_dataplus;
  e1.prefix._M_dataplus._M_p = (pointer)0x0;
  Engine::Engine(&e,"foo",(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_a0);
  if (local_a0._M_head_impl != (Handler *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_Handler[3])();
  }
  local_a0._M_head_impl = (Handler *)0x0;
  if (e1.prefix._M_dataplus._M_p != (pointer)0x0) {
    (**(code **)(*(long *)e1.prefix._M_dataplus._M_p + 0x18))();
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&e1,"\"foo\"","e.prefix",(char (*) [4])0x166245,&e.prefix);
  if ((char)e1.prefix._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (e1.prefix._M_string_length == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)e1.prefix._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x13,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar_3);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&e1.prefix._M_string_length);
    local_c8.data_._0_4_ = 1;
    pvVar2 = Engine::GetHandlers(&e);
    gtest_ar_3._0_8_ =
         (long)(pvVar2->
               super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(pvVar2->
               super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 3;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&e1,"1","e.GetHandlers().size()",(int *)&local_c8,
               (unsigned_long *)&gtest_ar_3);
    if ((char)e1.prefix._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&gtest_ar_3);
      if (e1.prefix._M_string_length == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)e1.prefix._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x14,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar_3);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&e1.prefix._M_string_length);
      gtest_ar_3.success_ = false;
      gtest_ar_3._1_7_ = 0;
      pvVar2 = Engine::GetHandlers(&e);
      _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
      super__Head_base<0UL,_Handler_*,_false>._M_head_impl =
           (((pvVar2->
             super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t;
      if ((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
          _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
          super__Head_base<0UL,_Handler_*,_false>._M_head_impl == (Handler *)0x0) {
        local_c8.data_ = (AssertHelperData *)0x0;
      }
      else {
        local_c8.data_ =
             (AssertHelperData *)
             __dynamic_cast(_Var1._M_t.
                            super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
                            super__Head_base<0UL,_Handler_*,_false>._M_head_impl,&Handler::typeinfo,
                            &TestHandler::typeinfo,0);
      }
      testing::internal::CmpHelperNE<decltype(nullptr),TestHandler*>
                ((internal *)&e1,"nullptr","dynamic_cast<TestHandler *>(e.GetHandlers()[0].get())",
                 (void **)&gtest_ar_3,(TestHandler **)&local_c8);
      if ((char)e1.prefix._M_dataplus._M_p != '\0') {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&e1.prefix._M_string_length);
        std::__cxx11::string::string((string *)&local_60,"foo",(allocator *)&local_c8);
        std::make_unique<TestHandler>();
        local_a8._M_head_impl = (Handler *)gtest_ar_3._0_8_;
        gtest_ar_3.success_ = false;
        gtest_ar_3._1_7_ = 0;
        Engine::Engine(&e1,&local_60,(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_a8
                      );
        if (local_a8._M_head_impl != (Handler *)0x0) {
          (*(local_a8._M_head_impl)->_vptr_Handler[3])();
        }
        local_a8._M_head_impl = (Handler *)0x0;
        if (gtest_ar_3._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_3._0_8_ + 0x18))();
        }
        std::__cxx11::string::~string((string *)&local_60);
        testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                  ((internal *)&gtest_ar_3,"\"foo\"","e1.prefix",(char (*) [4])0x166245,&e1.prefix);
        if (gtest_ar_3.success_ == false) {
          testing::Message::Message((Message *)&local_c8);
          if (gtest_ar_3.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                     ,0x17,pcVar3);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
LAB_00111b28:
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_c8);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_3.message_);
          local_b0.data_._0_4_ = 1;
          pvVar2 = Engine::GetHandlers(&e1);
          local_c8.data_ =
               (AssertHelperData *)
               ((long)(pvVar2->
                      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar2->
                      super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3);
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&gtest_ar_3,"1","e1.GetHandlers().size()",(int *)&local_b0,
                     (unsigned_long *)&local_c8);
          if (gtest_ar_3.success_ == false) {
            testing::Message::Message((Message *)&local_c8);
            if (gtest_ar_3.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                       ,0x18,pcVar3);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
            goto LAB_00111b28;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_3.message_);
          local_c8.data_ = (AssertHelperData *)0x0;
          pvVar2 = Engine::GetHandlers(&e1);
          _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
          super__Head_base<0UL,_Handler_*,_false>._M_head_impl =
               (((pvVar2->
                 super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t;
          if ((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
              _Var1._M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
              super__Head_base<0UL,_Handler_*,_false>._M_head_impl == (Handler *)0x0) {
            local_b0.data_ = (AssertHelperData *)0x0;
          }
          else {
            local_b0.data_ =
                 (AssertHelperData *)
                 __dynamic_cast(_Var1._M_t.
                                super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
                                super__Head_base<0UL,_Handler_*,_false>._M_head_impl,
                                &Handler::typeinfo,&TestHandler::typeinfo,0);
          }
          testing::internal::CmpHelperNE<decltype(nullptr),TestHandler*>
                    ((internal *)&gtest_ar_3,"nullptr",
                     "dynamic_cast<TestHandler *>(e1.GetHandlers()[0].get())",&local_c8.data_,
                     (TestHandler **)&local_b0);
          if (gtest_ar_3.success_ == false) {
            testing::Message::Message((Message *)&local_c8);
            if (gtest_ar_3.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                       ,0x19,pcVar3);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_c8);
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_3.message_);
        Engine::~Engine(&e1);
        goto LAB_00111a5c;
      }
      testing::Message::Message((Message *)&gtest_ar_3);
      if (e1.prefix._M_string_length == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)e1.prefix._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x15,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar_3);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_3);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&e1.prefix._M_string_length);
LAB_00111a5c:
  Engine::~Engine(&e);
  return;
}

Assistant:

TEST(Engine, testConstructWithHandler) {
    Engine e("foo", std::move(std::make_unique<TestHandler>()));
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(1, e.GetHandlers().size());
    ASSERT_NE(nullptr, dynamic_cast<TestHandler *>(e.GetHandlers()[0].get()));
    Engine e1(std::string("foo"), std::move(std::make_unique<TestHandler>()));
    ASSERT_EQ("foo", e1.prefix);
    ASSERT_EQ(1, e1.GetHandlers().size());
    ASSERT_NE(nullptr, dynamic_cast<TestHandler *>(e1.GetHandlers()[0].get()));
}